

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spherei_intersector.h
# Opt level: O2

void embree::avx::SphereMiIntersector1<8,_true>::intersect
               (Precalculations *pre,RayHit *ray,RayQueryContext *context,Primitive *sphere)

{
  undefined4 uVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  Geometry *pGVar5;
  long lVar6;
  __int_type_conflict _Var7;
  RTCFilterFunctionN p_Var8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  uint uVar20;
  uint uVar21;
  uint uVar22;
  Scene *pSVar23;
  ulong uVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [64];
  float fVar31;
  float fVar35;
  float fVar36;
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  float fVar37;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  float fVar47;
  undefined1 auVar40 [32];
  undefined1 auVar48 [36];
  undefined1 auVar49 [36];
  undefined1 auVar50 [36];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [64];
  undefined1 auVar55 [32];
  undefined1 in_ZMM7 [64];
  undefined1 auVar57 [64];
  undefined1 in_ZMM8 [64];
  undefined1 auVar58 [64];
  undefined1 auVar59 [28];
  undefined1 auVar60 [64];
  undefined1 auVar61 [28];
  undefined1 auVar62 [64];
  undefined1 auVar63 [28];
  undefined1 auVar64 [64];
  undefined1 auVar65 [64];
  undefined1 auVar66 [32];
  undefined1 auVar67 [64];
  undefined1 auVar68 [28];
  undefined1 auVar69 [64];
  undefined1 auVar70 [64];
  RTCFilterFunctionNArguments args;
  HitK<1> h;
  vbool<8> valid;
  SphereIntersectorHitM<8> hit;
  int local_308;
  float local_304;
  RTCFilterFunctionNArguments local_300;
  float local_2d0;
  undefined4 local_2cc;
  undefined4 local_2c8;
  undefined8 local_2c4;
  uint local_2bc;
  uint local_2b8;
  uint local_2b4;
  uint local_2b0;
  undefined1 local_2a0 [32];
  Scene *local_268;
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [16];
  undefined1 local_190 [16];
  undefined1 local_180 [32];
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  undefined1 local_120 [32];
  undefined1 local_100 [32];
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  undefined1 auVar56 [64];
  
  pSVar23 = context->scene;
  pGVar5 = (pSVar23->geometries).items[sphere->sharedGeomID].ptr;
  lVar6 = *(long *)&pGVar5->field_0x58;
  _Var7 = pGVar5[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  auVar26._16_16_ = *(undefined1 (*) [16])(lVar6 + (sphere->primIDs).field_0.i[4] * _Var7);
  auVar26._0_16_ = *(undefined1 (*) [16])(lVar6 + (sphere->primIDs).field_0.i[0] * _Var7);
  auVar32._16_16_ = *(undefined1 (*) [16])(lVar6 + (sphere->primIDs).field_0.i[5] * _Var7);
  auVar32._0_16_ = *(undefined1 (*) [16])(lVar6 + (sphere->primIDs).field_0.i[1] * _Var7);
  auVar38._16_16_ = *(undefined1 (*) [16])(lVar6 + (sphere->primIDs).field_0.i[6] * _Var7);
  auVar38._0_16_ = *(undefined1 (*) [16])(lVar6 + (sphere->primIDs).field_0.i[2] * _Var7);
  auVar34._16_16_ = *(undefined1 (*) [16])(lVar6 + (sphere->primIDs).field_0.i[7] * _Var7);
  auVar34._0_16_ = *(undefined1 (*) [16])(lVar6 + (sphere->primIDs).field_0.i[3] * _Var7);
  auVar39 = vunpcklps_avx(auVar26,auVar38);
  auVar26 = vunpckhps_avx(auVar26,auVar38);
  auVar66 = vunpcklps_avx(auVar32,auVar34);
  auVar34 = vunpckhps_avx(auVar32,auVar34);
  auVar32 = vunpcklps_avx(auVar39,auVar66);
  auVar39 = vunpckhps_avx(auVar39,auVar66);
  auVar66 = vunpcklps_avx(auVar26,auVar34);
  auVar53 = vunpckhps_avx(auVar26,auVar34);
  local_190 = vpshufd_avx(ZEXT416(sphere->sharedGeomID),0);
  local_1a0 = local_190;
  auVar25 = vpalignr_avx(*(undefined1 (*) [16])((long)&(ray->super_RayK<1>).dir.field_0 + 8),
                         *(undefined1 (*) [16])((long)&(ray->super_RayK<1>).org.field_0 + 8),8);
  auVar25 = vdpps_avx(auVar25,auVar25,0x7f);
  auVar9 = vrcpss_avx(auVar25,auVar25);
  auVar25 = ZEXT416((uint)(auVar9._0_4_ * (2.0 - auVar25._0_4_ * auVar9._0_4_)));
  auVar9 = vshufps_avx(auVar25,auVar25,0);
  uVar1 = *(undefined4 *)&(ray->super_RayK<1>).org.field_0;
  auVar51._4_4_ = uVar1;
  auVar51._0_4_ = uVar1;
  auVar51._8_4_ = uVar1;
  auVar51._12_4_ = uVar1;
  auVar51._16_4_ = uVar1;
  auVar51._20_4_ = uVar1;
  auVar51._24_4_ = uVar1;
  auVar51._28_4_ = uVar1;
  auVar26 = vsubps_avx(auVar32,auVar51);
  uVar1 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 4);
  auVar52._4_4_ = uVar1;
  auVar52._0_4_ = uVar1;
  auVar52._8_4_ = uVar1;
  auVar52._12_4_ = uVar1;
  auVar52._16_4_ = uVar1;
  auVar52._20_4_ = uVar1;
  auVar52._24_4_ = uVar1;
  auVar52._28_4_ = uVar1;
  auVar34 = vsubps_avx(auVar39,auVar52);
  fVar31 = *(float *)((long)&(ray->super_RayK<1>).org.field_0 + 8);
  auVar39._4_4_ = fVar31;
  auVar39._0_4_ = fVar31;
  auVar39._8_4_ = fVar31;
  auVar39._12_4_ = fVar31;
  auVar39._16_4_ = fVar31;
  auVar39._20_4_ = fVar31;
  auVar39._24_4_ = fVar31;
  auVar39._28_4_ = fVar31;
  auVar39 = vsubps_avx(auVar66,auVar39);
  fVar2 = (ray->super_RayK<1>).dir.field_0.m128[0];
  auVar60 = ZEXT3264(CONCAT428(fVar2,CONCAT424(fVar2,CONCAT420(fVar2,CONCAT416(fVar2,CONCAT412(fVar2
                                                  ,CONCAT48(fVar2,CONCAT44(fVar2,fVar2))))))));
  fVar3 = (ray->super_RayK<1>).dir.field_0.m128[1];
  auVar62 = ZEXT3264(CONCAT428(fVar3,CONCAT424(fVar3,CONCAT420(fVar3,CONCAT416(fVar3,CONCAT412(fVar3
                                                  ,CONCAT48(fVar3,CONCAT44(fVar3,fVar3))))))));
  fVar4 = (ray->super_RayK<1>).dir.field_0.m128[2];
  auVar64 = ZEXT3264(CONCAT428(fVar4,CONCAT424(fVar4,CONCAT420(fVar4,CONCAT416(fVar4,CONCAT412(fVar4
                                                  ,CONCAT48(fVar4,CONCAT44(fVar4,fVar4))))))));
  fVar47 = fVar31 + 0.0 + 0.0;
  fVar31 = auVar9._0_4_;
  fVar37 = fVar31 * (fVar2 * auVar26._0_4_ + fVar3 * auVar34._0_4_ + fVar4 * auVar39._0_4_);
  fVar35 = auVar9._4_4_;
  fVar41 = fVar35 * (fVar2 * auVar26._4_4_ + fVar3 * auVar34._4_4_ + fVar4 * auVar39._4_4_);
  auVar11._4_4_ = fVar41;
  auVar11._0_4_ = fVar37;
  fVar36 = auVar9._8_4_;
  fVar42 = fVar36 * (fVar2 * auVar26._8_4_ + fVar3 * auVar34._8_4_ + fVar4 * auVar39._8_4_);
  auVar11._8_4_ = fVar42;
  fVar43 = auVar9._12_4_ *
           (fVar2 * auVar26._12_4_ + fVar3 * auVar34._12_4_ + fVar4 * auVar39._12_4_);
  auVar11._12_4_ = fVar43;
  fVar44 = fVar31 * (fVar2 * auVar26._16_4_ + fVar3 * auVar34._16_4_ + fVar4 * auVar39._16_4_);
  auVar11._16_4_ = fVar44;
  fVar45 = fVar35 * (fVar2 * auVar26._20_4_ + fVar3 * auVar34._20_4_ + fVar4 * auVar39._20_4_);
  auVar11._20_4_ = fVar45;
  fVar46 = fVar36 * (fVar2 * auVar26._24_4_ + fVar3 * auVar34._24_4_ + fVar4 * auVar39._24_4_);
  auVar11._24_4_ = fVar46;
  auVar11._28_4_ = fVar47;
  auVar66._4_4_ = fVar2 * fVar41;
  auVar66._0_4_ = fVar2 * fVar37;
  auVar66._8_4_ = fVar2 * fVar42;
  auVar66._12_4_ = fVar2 * fVar43;
  auVar66._16_4_ = fVar2 * fVar44;
  auVar66._20_4_ = fVar2 * fVar45;
  auVar66._24_4_ = fVar2 * fVar46;
  auVar66._28_4_ = 0;
  auVar58._0_4_ = fVar3 * fVar37;
  auVar58._4_4_ = fVar3 * fVar41;
  auVar58._8_4_ = fVar3 * fVar42;
  auVar58._12_4_ = fVar3 * fVar43;
  auVar58._16_4_ = fVar3 * fVar44;
  auVar58._20_4_ = fVar3 * fVar45;
  auVar58._28_36_ = in_ZMM7._28_36_;
  auVar58._24_4_ = fVar3 * fVar46;
  auVar56._0_4_ = fVar4 * fVar37;
  auVar56._4_4_ = fVar4 * fVar41;
  auVar56._8_4_ = fVar4 * fVar42;
  auVar56._12_4_ = fVar4 * fVar43;
  auVar56._16_4_ = fVar4 * fVar44;
  auVar56._20_4_ = fVar4 * fVar45;
  auVar56._28_36_ = in_ZMM8._28_36_;
  auVar56._24_4_ = fVar4 * fVar46;
  auVar66 = vsubps_avx(auVar26,auVar66);
  auVar65 = ZEXT3264(auVar66);
  auVar32 = vsubps_avx(auVar34,auVar58._0_32_);
  auVar67 = ZEXT3264(auVar32);
  auVar38 = vsubps_avx(auVar39,auVar56._0_32_);
  auVar58 = ZEXT3264(auVar38);
  auVar17._4_4_ =
       auVar66._4_4_ * auVar66._4_4_ + auVar32._4_4_ * auVar32._4_4_ + auVar38._4_4_ * auVar38._4_4_
  ;
  auVar17._0_4_ =
       auVar66._0_4_ * auVar66._0_4_ + auVar32._0_4_ * auVar32._0_4_ + auVar38._0_4_ * auVar38._0_4_
  ;
  auVar17._8_4_ =
       auVar66._8_4_ * auVar66._8_4_ + auVar32._8_4_ * auVar32._8_4_ + auVar38._8_4_ * auVar38._8_4_
  ;
  auVar17._12_4_ =
       auVar66._12_4_ * auVar66._12_4_ +
       auVar32._12_4_ * auVar32._12_4_ + auVar38._12_4_ * auVar38._12_4_;
  auVar17._16_4_ =
       auVar66._16_4_ * auVar66._16_4_ +
       auVar32._16_4_ * auVar32._16_4_ + auVar38._16_4_ * auVar38._16_4_;
  auVar17._20_4_ =
       auVar66._20_4_ * auVar66._20_4_ +
       auVar32._20_4_ * auVar32._20_4_ + auVar38._20_4_ * auVar38._20_4_;
  auVar17._24_4_ =
       auVar66._24_4_ * auVar66._24_4_ +
       auVar32._24_4_ * auVar32._24_4_ + auVar38._24_4_ * auVar38._24_4_;
  auVar17._28_4_ = auVar39._28_4_ + auVar39._28_4_ + auVar26._28_4_;
  auVar10._4_4_ = auVar53._4_4_ * auVar53._4_4_;
  auVar10._0_4_ = auVar53._0_4_ * auVar53._0_4_;
  auVar10._8_4_ = auVar53._8_4_ * auVar53._8_4_;
  auVar10._12_4_ = auVar53._12_4_ * auVar53._12_4_;
  auVar10._16_4_ = auVar53._16_4_ * auVar53._16_4_;
  auVar10._20_4_ = auVar53._20_4_ * auVar53._20_4_;
  auVar10._24_4_ = auVar53._24_4_ * auVar53._24_4_;
  auVar10._28_4_ = auVar53._28_4_;
  auVar26 = vcmpps_avx(auVar17,auVar10,2);
  auVar25 = vpshufd_avx(ZEXT116(sphere->numPrimitives),0);
  auVar53._16_16_ = auVar25;
  auVar53._0_16_ = auVar25;
  auVar34 = vcvtdq2ps_avx(auVar53);
  auVar34 = vcmpps_avx(_DAT_01f7b060,auVar34,1);
  auVar39 = auVar34 & auVar26;
  if ((((((((auVar39 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
           (auVar39 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
          (auVar39 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
         SUB321(auVar39 >> 0x7f,0) != '\0') ||
        (auVar39 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
       SUB321(auVar39 >> 0xbf,0) != '\0') ||
      (auVar39 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar39[0x1f] < '\0') {
    auVar26 = vandps_avx(auVar26,auVar34);
    auVar34 = vsubps_avx(auVar10,auVar17);
    auVar12._4_4_ = fVar35 * auVar34._4_4_;
    auVar12._0_4_ = fVar31 * auVar34._0_4_;
    auVar12._8_4_ = fVar36 * auVar34._8_4_;
    auVar12._12_4_ = auVar9._12_4_ * auVar34._12_4_;
    auVar12._16_4_ = fVar31 * auVar34._16_4_;
    auVar12._20_4_ = fVar35 * auVar34._20_4_;
    auVar12._24_4_ = fVar36 * auVar34._24_4_;
    auVar12._28_4_ = auVar34._28_4_;
    auVar10 = vsqrtps_avx(auVar12);
    auVar69 = ZEXT3264(auVar10);
    auVar11 = vsubps_avx(auVar11,auVar10);
    auVar55._0_4_ = auVar10._0_4_ + fVar37;
    auVar55._4_4_ = auVar10._4_4_ + fVar41;
    auVar55._8_4_ = auVar10._8_4_ + fVar42;
    auVar55._12_4_ = auVar10._12_4_ + fVar43;
    auVar55._16_4_ = auVar10._16_4_ + fVar44;
    auVar55._20_4_ = auVar10._20_4_ + fVar45;
    auVar55._24_4_ = auVar10._24_4_ + fVar46;
    auVar55._28_4_ = auVar10._28_4_ + fVar47;
    auVar56 = ZEXT3264(auVar55);
    auVar25 = SUB3216(*(undefined1 (*) [32])((long)&(ray->super_RayK<1>).org.field_0 + 0xc),0);
    auVar25 = vshufps_avx(auVar25,auVar25,0);
    auVar33._16_16_ = auVar25;
    auVar33._0_16_ = auVar25;
    auVar34 = vcmpps_avx(auVar33,auVar11,2);
    fVar31 = (ray->super_RayK<1>).tfar;
    auVar18._4_4_ = fVar31;
    auVar18._0_4_ = fVar31;
    auVar18._8_4_ = fVar31;
    auVar18._12_4_ = fVar31;
    auVar18._16_4_ = fVar31;
    auVar18._20_4_ = fVar31;
    auVar18._24_4_ = fVar31;
    auVar18._28_4_ = fVar31;
    auVar39 = vcmpps_avx(auVar11,auVar18,2);
    auVar34 = vandps_avx(auVar39,auVar34);
    auVar34 = vandps_avx(auVar34,auVar26);
    auVar70 = ZEXT3264(auVar34);
    auVar39 = vcmpps_avx(auVar33,auVar55,2);
    auVar53 = vcmpps_avx(auVar55,auVar18,2);
    auVar39 = vandps_avx(auVar53,auVar39);
    local_1c0 = vandps_avx(auVar39,auVar26);
    auVar39 = vorps_avx(auVar34,local_1c0);
    if ((((((((auVar39 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar39 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar39 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar39 >> 0x7f,0) != '\0') ||
          (auVar39 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar39 >> 0xbf,0) != '\0') ||
        (auVar39 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar39[0x1f] < '\0')
    {
      auVar40._0_8_ = auVar10._0_8_ ^ 0x8000000080000000;
      auVar40._8_4_ = -auVar10._8_4_;
      auVar40._12_4_ = -auVar10._12_4_;
      auVar40._16_4_ = -auVar10._16_4_;
      auVar40._20_4_ = -auVar10._20_4_;
      auVar40._24_4_ = -auVar10._24_4_;
      auVar40._28_4_ = -auVar10._28_4_;
      local_260 = vblendvps_avx(auVar55,auVar11,auVar34);
      auVar53 = vblendvps_avx(auVar10,auVar40,auVar34);
      auVar34 = *(undefined1 (*) [32])&(ray->super_RayK<1>).tfar;
      auVar30 = ZEXT3264(auVar34);
      fVar35 = auVar53._0_4_;
      fVar36 = auVar53._4_4_;
      auVar13._4_4_ = fVar2 * fVar36;
      auVar13._0_4_ = fVar2 * fVar35;
      fVar37 = auVar53._8_4_;
      auVar13._8_4_ = fVar2 * fVar37;
      fVar41 = auVar53._12_4_;
      auVar13._12_4_ = fVar2 * fVar41;
      fVar42 = auVar53._16_4_;
      auVar13._16_4_ = fVar2 * fVar42;
      fVar43 = auVar53._20_4_;
      auVar13._20_4_ = fVar2 * fVar43;
      fVar44 = auVar53._24_4_;
      auVar13._24_4_ = fVar2 * fVar44;
      auVar13._28_4_ = fVar31;
      auVar14._4_4_ = fVar3 * fVar36;
      auVar14._0_4_ = fVar3 * fVar35;
      auVar14._8_4_ = fVar3 * fVar37;
      auVar14._12_4_ = fVar3 * fVar41;
      auVar14._16_4_ = fVar3 * fVar42;
      auVar14._20_4_ = fVar3 * fVar43;
      auVar14._24_4_ = fVar3 * fVar44;
      auVar14._28_4_ = auVar26._28_4_;
      auVar15._4_4_ = fVar4 * fVar36;
      auVar15._0_4_ = fVar4 * fVar35;
      auVar15._8_4_ = fVar4 * fVar37;
      auVar15._12_4_ = fVar4 * fVar41;
      auVar15._16_4_ = fVar4 * fVar42;
      auVar15._20_4_ = fVar4 * fVar43;
      auVar15._24_4_ = fVar4 * fVar44;
      auVar15._28_4_ = auVar53._28_4_;
      local_240 = vsubps_avx(auVar13,auVar66);
      local_220 = vsubps_avx(auVar14,auVar32);
      local_200 = vsubps_avx(auVar15,auVar38);
      local_2a0 = auVar39;
      auVar19._8_4_ = 0x7f800000;
      auVar19._0_8_ = 0x7f8000007f800000;
      auVar19._12_4_ = 0x7f800000;
      auVar19._16_4_ = 0x7f800000;
      auVar19._20_4_ = 0x7f800000;
      auVar19._24_4_ = 0x7f800000;
      auVar19._28_4_ = 0x7f800000;
      local_80 = local_260;
      auVar26 = vblendvps_avx(auVar19,local_260,auVar39);
      auVar54 = ZEXT3264(auVar19);
      auVar66 = vshufps_avx(auVar26,auVar26,0xb1);
      auVar66 = vminps_avx(auVar26,auVar66);
      auVar32 = vshufpd_avx(auVar66,auVar66,5);
      auVar66 = vminps_avx(auVar66,auVar32);
      auVar32 = vperm2f128_avx(auVar66,auVar66,1);
      auVar66 = vminps_avx(auVar66,auVar32);
      auVar26 = vcmpps_avx(auVar26,auVar66,0);
      auVar32 = auVar39 & auVar26;
      if ((((((((auVar32 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar32 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar32 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar32 >> 0x7f,0) != '\0') ||
            (auVar32 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar32 >> 0xbf,0) != '\0') ||
          (auVar32 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar32[0x1f] < '\0') {
        auVar39 = vandps_avx(auVar26,auVar39);
      }
      auVar25 = auVar34._0_16_;
      uVar20 = vextractps_avx(auVar25,1);
      uVar21 = vmovmskps_avx(auVar39);
      uVar22 = 0;
      if (uVar21 != 0) {
        for (; (uVar21 >> uVar22 & 1) == 0; uVar22 = uVar22 + 1) {
        }
      }
      auVar57 = ZEXT1664(auVar25);
LAB_00952722:
      uVar21 = auVar66._28_4_;
      auVar49 = ZEXT436(uVar21);
      auVar34 = auVar58._0_32_;
      auVar66 = auVar67._0_32_;
      auVar39 = auVar65._0_32_;
      auVar63 = auVar64._0_28_;
      auVar50 = ZEXT436(uVar21);
      auVar61 = auVar62._0_28_;
      auVar48 = ZEXT436(auVar26._28_4_);
      auVar68 = auVar69._0_28_;
      auVar59 = auVar60._0_28_;
      auVar32 = auVar70._0_32_;
      uVar24 = (ulong)uVar22;
      local_2b8 = *(uint *)(local_1a0 + uVar24 * 4);
      pGVar5 = (pSVar23->geometries).items[local_2b8].ptr;
      if ((pGVar5->mask & uVar20) == 0) {
        *(undefined4 *)(local_2a0 + uVar24 * 4) = 0;
        auVar48 = ZEXT436(auVar26._28_4_);
        auVar50 = ZEXT436(uVar21);
      }
      else {
        if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
           (pGVar5->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
          auVar57 = ZEXT464((uint)*(float *)(local_260 + uVar24 * 4));
          (ray->super_RayK<1>).tfar = *(float *)(local_260 + uVar24 * 4);
          (ray->Ng).field_0.field_0.x = *(float *)(local_240 + uVar24 * 4);
          (ray->Ng).field_0.field_0.y = *(float *)(local_220 + uVar24 * 4);
          (ray->Ng).field_0.field_0.z = *(float *)(local_200 + uVar24 * 4);
          ray->u = 0.0;
          ray->v = 0.0;
          ray->primID = (sphere->primIDs).field_0.i[uVar24];
          ray->geomID = local_2b8;
          ray->instID[0] = context->user->instID[0];
          ray->instPrimID[0] = context->user->instPrimID[0];
          auVar25 = SUB3216(*(undefined1 (*) [32])&(ray->super_RayK<1>).tfar,0);
          uVar20 = (ray->super_RayK<1>).mask;
LAB_00952a75:
          auVar26 = vandps_avx(auVar32,local_1c0);
          auVar25 = vshufps_avx(auVar25,auVar25,0);
          auVar28._16_16_ = auVar25;
          auVar28._0_16_ = auVar25;
          local_260 = auVar56._0_32_;
          auVar32 = vcmpps_avx(local_260,auVar28,2);
          auVar38 = auVar26 & auVar32;
          if ((((((((auVar38 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar38 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar38 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar38 >> 0x7f,0) == '\0') &&
                (auVar38 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar38 >> 0xbf,0) == '\0') &&
              (auVar38 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar38[0x1f]) {
            return;
          }
          auVar32 = vandps_avx(auVar32,auVar26);
          fVar31 = auVar68._0_4_;
          fVar2 = auVar68._4_4_;
          auVar16._4_4_ = auVar59._4_4_ * fVar2;
          auVar16._0_4_ = auVar59._0_4_ * fVar31;
          fVar3 = auVar68._8_4_;
          auVar16._8_4_ = auVar59._8_4_ * fVar3;
          fVar4 = auVar68._12_4_;
          auVar16._12_4_ = auVar59._12_4_ * fVar4;
          fVar35 = auVar68._16_4_;
          auVar16._16_4_ = auVar59._16_4_ * fVar35;
          fVar36 = auVar68._20_4_;
          auVar16._20_4_ = auVar59._20_4_ * fVar36;
          fVar37 = auVar68._24_4_;
          auVar16._24_4_ = auVar59._24_4_ * fVar37;
          auVar16._28_4_ = auVar26._28_4_;
          auVar62._0_4_ = auVar61._0_4_ * fVar31;
          auVar62._4_4_ = auVar61._4_4_ * fVar2;
          auVar62._8_4_ = auVar61._8_4_ * fVar3;
          auVar62._12_4_ = auVar61._12_4_ * fVar4;
          auVar62._16_4_ = auVar61._16_4_ * fVar35;
          auVar62._20_4_ = auVar61._20_4_ * fVar36;
          auVar62._24_4_ = auVar61._24_4_ * fVar37;
          auVar62._28_36_ = auVar48;
          auVar60._4_4_ = auVar63._4_4_ * fVar2;
          auVar60._0_4_ = auVar63._0_4_ * fVar31;
          auVar60._8_4_ = auVar63._8_4_ * fVar3;
          auVar60._12_4_ = auVar63._12_4_ * fVar4;
          auVar60._16_4_ = auVar63._16_4_ * fVar35;
          auVar60._20_4_ = auVar63._20_4_ * fVar36;
          auVar60._24_4_ = auVar63._24_4_ * fVar37;
          auVar60._28_36_ = auVar50;
          local_240 = vsubps_avx(auVar16,auVar39);
          local_220 = vsubps_avx(auVar62._0_32_,auVar66);
          local_200 = vsubps_avx(auVar60._0_32_,auVar34);
          pSVar23 = context->scene;
          local_2a0 = auVar32;
          auVar26 = vblendvps_avx(auVar54._0_32_,local_260,auVar32);
          auVar34 = vshufps_avx(auVar26,auVar26,0xb1);
          auVar34 = vminps_avx(auVar26,auVar34);
          auVar39 = vshufpd_avx(auVar34,auVar34,5);
          auVar34 = vminps_avx(auVar34,auVar39);
          auVar39 = vperm2f128_avx(auVar34,auVar34,1);
          auVar34 = vminps_avx(auVar34,auVar39);
          auVar26 = vcmpps_avx(auVar26,auVar34,0);
          auVar34 = auVar32 & auVar26;
          if ((((((((auVar34 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar34 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar34 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar34 >> 0x7f,0) != '\0') ||
                (auVar34 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar34 >> 0xbf,0) != '\0') ||
              (auVar34 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar34[0x1f] < '\0') {
            auVar32 = vandps_avx(auVar26,auVar32);
          }
          uVar21 = vmovmskps_avx(auVar32);
          uVar22 = 0;
          if (uVar21 != 0) {
            for (; (uVar21 >> uVar22 & 1) == 0; uVar22 = uVar22 + 1) {
            }
          }
          do {
            uVar24 = (ulong)uVar22;
            local_2b8 = *(uint *)(local_1a0 + uVar24 * 4);
            pGVar5 = (pSVar23->geometries).items[local_2b8].ptr;
            if ((pGVar5->mask & uVar20) == 0) {
              *(undefined4 *)(local_2a0 + uVar24 * 4) = 0;
            }
            else {
              if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                 (pGVar5->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                (ray->super_RayK<1>).tfar = *(float *)(local_260 + uVar24 * 4);
                (ray->Ng).field_0.field_0.x = *(float *)(local_240 + uVar24 * 4);
                (ray->Ng).field_0.field_0.y = *(float *)(local_220 + uVar24 * 4);
                (ray->Ng).field_0.field_0.z = *(float *)(local_200 + uVar24 * 4);
                ray->u = 0.0;
                ray->v = 0.0;
                ray->primID = (sphere->primIDs).field_0.i[uVar24];
                ray->geomID = local_2b8;
                ray->instID[0] = context->user->instID[0];
                ray->instPrimID[0] = context->user->instPrimID[0];
                return;
              }
              local_1c0._0_8_ = pSVar23;
              local_304 = auVar57._0_4_;
              local_1e0 = auVar56._0_32_;
              local_2d0 = *(float *)(local_240 + uVar24 * 4);
              local_2cc = *(undefined4 *)(local_220 + uVar24 * 4);
              local_2c8 = *(undefined4 *)(local_200 + uVar24 * 4);
              local_2c4 = 0;
              local_2bc = (sphere->primIDs).field_0.i[uVar24];
              local_2b4 = context->user->instID[0];
              local_2b0 = context->user->instPrimID[0];
              (ray->super_RayK<1>).tfar = *(float *)(local_260 + uVar24 * 4);
              local_308 = -1;
              local_300.valid = &local_308;
              local_300.geometryUserPtr = pGVar5->userPtr;
              local_300.context = context->user;
              local_300.ray = (RTCRayN *)ray;
              local_300.hit = (RTCHitN *)&local_2d0;
              local_300.N = 1;
              if ((pGVar5->intersectionFilterN == (RTCFilterFunctionN)0x0) ||
                 ((*pGVar5->intersectionFilterN)(&local_300), *local_300.valid != 0)) {
                p_Var8 = context->args->filter;
                if ((p_Var8 != (RTCFilterFunctionN)0x0) &&
                   ((((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                      RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar5->field_8).field_0x2 & 0x40) != 0))
                    && ((*p_Var8)(&local_300), *local_300.valid == 0)))) goto LAB_00952d10;
                (((Vec3f *)((long)local_300.ray + 0x30))->field_0).field_0.x =
                     *(float *)local_300.hit;
                (((Vec3f *)((long)local_300.ray + 0x30))->field_0).field_0.y =
                     *(float *)(local_300.hit + 4);
                (((Vec3f *)((long)local_300.ray + 0x30))->field_0).field_0.z =
                     *(float *)(local_300.hit + 8);
                *(float *)((long)local_300.ray + 0x3c) = *(float *)(local_300.hit + 0xc);
                *(float *)((long)local_300.ray + 0x40) = *(float *)(local_300.hit + 0x10);
                *(float *)((long)local_300.ray + 0x44) = *(float *)(local_300.hit + 0x14);
                *(float *)((long)local_300.ray + 0x48) = *(float *)(local_300.hit + 0x18);
                *(float *)((long)local_300.ray + 0x4c) = *(float *)(local_300.hit + 0x1c);
                *(float *)((long)local_300.ray + 0x50) = *(float *)(local_300.hit + 0x20);
              }
              else {
LAB_00952d10:
                (ray->super_RayK<1>).tfar = local_304;
              }
              auVar54 = ZEXT3264(CONCAT428(0x7f800000,
                                           CONCAT424(0x7f800000,
                                                     CONCAT420(0x7f800000,
                                                               CONCAT416(0x7f800000,
                                                                         CONCAT412(0x7f800000,
                                                                                   CONCAT48(
                                                  0x7f800000,0x7f8000007f800000)))))));
              pSVar23 = (Scene *)local_1c0._0_8_;
              *(undefined4 *)(local_2a0 + uVar24 * 4) = 0;
              fVar31 = (ray->super_RayK<1>).tfar;
              auVar29._4_4_ = fVar31;
              auVar29._0_4_ = fVar31;
              auVar29._8_4_ = fVar31;
              auVar29._12_4_ = fVar31;
              auVar29._16_4_ = fVar31;
              auVar29._20_4_ = fVar31;
              auVar29._24_4_ = fVar31;
              auVar29._28_4_ = fVar31;
              auVar56 = ZEXT3264(local_1e0);
              auVar26 = vcmpps_avx(local_1e0,auVar29,2);
              local_2a0 = vandps_avx(auVar26,local_2a0);
              uVar20 = (ray->super_RayK<1>).mask;
              auVar57 = ZEXT464((uint)(ray->super_RayK<1>).tfar);
            }
            if ((((((((local_2a0 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (local_2a0 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (local_2a0 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(local_2a0 >> 0x7f,0) == '\0') &&
                  (local_2a0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(local_2a0 >> 0xbf,0) == '\0') &&
                (local_2a0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < local_2a0[0x1f]) {
              return;
            }
            auVar26 = vblendvps_avx(auVar54._0_32_,auVar56._0_32_,local_2a0);
            auVar34 = vshufps_avx(auVar26,auVar26,0xb1);
            auVar34 = vminps_avx(auVar26,auVar34);
            auVar39 = vshufpd_avx(auVar34,auVar34,5);
            auVar34 = vminps_avx(auVar34,auVar39);
            auVar39 = vperm2f128_avx(auVar34,auVar34,1);
            auVar34 = vminps_avx(auVar34,auVar39);
            auVar34 = vcmpps_avx(auVar26,auVar34,0);
            auVar39 = local_2a0 & auVar34;
            auVar26 = local_2a0;
            if ((((((((auVar39 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar39 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar39 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar39 >> 0x7f,0) != '\0') ||
                  (auVar39 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar39 >> 0xbf,0) != '\0') ||
                (auVar39 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar39[0x1f] < '\0') {
              auVar26 = vandps_avx(auVar34,local_2a0);
            }
            uVar21 = vmovmskps_avx(auVar26);
            uVar22 = 0;
            if (uVar21 != 0) {
              for (; (uVar21 >> uVar22 & 1) == 0; uVar22 = uVar22 + 1) {
              }
            }
          } while( true );
        }
        local_180 = auVar32;
        local_160 = auVar69._0_32_;
        local_140 = auVar34;
        local_120 = auVar66;
        local_100 = auVar39;
        local_e0 = auVar64._0_32_;
        local_c0 = auVar62._0_32_;
        local_a0 = auVar60._0_32_;
        local_304 = auVar57._0_4_;
        local_268 = pSVar23;
        local_1e0 = auVar56._0_32_;
        auVar48 = (undefined1  [36])0x0;
        local_2d0 = *(float *)(local_240 + uVar24 * 4);
        local_2cc = *(undefined4 *)(local_220 + uVar24 * 4);
        local_2c8 = *(undefined4 *)(local_200 + uVar24 * 4);
        local_2c4 = 0;
        local_2bc = (sphere->primIDs).field_0.i[uVar24];
        local_2b4 = context->user->instID[0];
        local_2b0 = context->user->instPrimID[0];
        (ray->super_RayK<1>).tfar = *(float *)(local_260 + uVar24 * 4);
        local_308 = -1;
        local_300.valid = &local_308;
        local_300.geometryUserPtr = pGVar5->userPtr;
        local_300.context = context->user;
        local_300.ray = (RTCRayN *)ray;
        local_300.hit = (RTCHitN *)&local_2d0;
        local_300.N = 1;
        if (pGVar5->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_0095286c:
          p_Var8 = context->args->filter;
          if ((p_Var8 != (RTCFilterFunctionN)0x0) &&
             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
               RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar5->field_8).field_0x2 & 0x40) != 0)))) {
            auVar48 = (undefined1  [36])0x0;
            auVar49 = (undefined1  [36])0x0;
            (*p_Var8)(&local_300);
            if (*local_300.valid == 0) goto LAB_00952956;
          }
          (((Vec3f *)((long)local_300.ray + 0x30))->field_0).field_0.x = *(float *)local_300.hit;
          (((Vec3f *)((long)local_300.ray + 0x30))->field_0).field_0.y =
               *(float *)(local_300.hit + 4);
          (((Vec3f *)((long)local_300.ray + 0x30))->field_0).field_0.z =
               *(float *)(local_300.hit + 8);
          *(float *)((long)local_300.ray + 0x3c) = *(float *)(local_300.hit + 0xc);
          *(float *)((long)local_300.ray + 0x40) = *(float *)(local_300.hit + 0x10);
          *(float *)((long)local_300.ray + 0x44) = *(float *)(local_300.hit + 0x14);
          *(float *)((long)local_300.ray + 0x48) = *(float *)(local_300.hit + 0x18);
          *(float *)((long)local_300.ray + 0x4c) = *(float *)(local_300.hit + 0x1c);
          *(float *)((long)local_300.ray + 0x50) = *(float *)(local_300.hit + 0x20);
        }
        else {
          auVar48 = (undefined1  [36])0x0;
          auVar49 = SUB6036((undefined1  [60])0x0,0x18);
          (*pGVar5->intersectionFilterN)(&local_300);
          if (*local_300.valid != 0) goto LAB_0095286c;
LAB_00952956:
          (ray->super_RayK<1>).tfar = local_304;
        }
        pSVar23 = local_268;
        auVar56 = ZEXT3264(local_1e0);
        auVar54 = ZEXT3264(CONCAT428(0x7f800000,
                                     CONCAT424(0x7f800000,
                                               CONCAT420(0x7f800000,
                                                         CONCAT416(0x7f800000,
                                                                   CONCAT412(0x7f800000,
                                                                             CONCAT48(0x7f800000,
                                                                                                                                                                            
                                                  0x7f8000007f800000)))))));
        auVar60 = ZEXT3264(local_a0);
        auVar62 = ZEXT3264(local_c0);
        auVar64 = ZEXT3264(local_e0);
        auVar65 = ZEXT3264(local_100);
        auVar67 = ZEXT3264(local_120);
        auVar58 = ZEXT3264(local_140);
        auVar69 = ZEXT3264(local_160);
        auVar70 = ZEXT3264(local_180);
        *(undefined4 *)(local_2a0 + uVar24 * 4) = 0;
        fVar31 = (ray->super_RayK<1>).tfar;
        auVar27._4_4_ = fVar31;
        auVar27._0_4_ = fVar31;
        auVar27._8_4_ = fVar31;
        auVar27._12_4_ = fVar31;
        auVar27._16_4_ = fVar31;
        auVar27._20_4_ = fVar31;
        auVar27._24_4_ = fVar31;
        auVar27._28_4_ = fVar31;
        auVar26 = vcmpps_avx(local_80,auVar27,2);
        local_2a0 = vandps_avx(auVar26,local_2a0);
        auVar30 = ZEXT3264(*(undefined1 (*) [32])&(ray->super_RayK<1>).tfar);
        uVar20 = (ray->super_RayK<1>).mask;
        auVar57 = ZEXT464((uint)(ray->super_RayK<1>).tfar);
        auVar50 = auVar49;
      }
      auVar34 = auVar58._0_32_;
      auVar66 = auVar67._0_32_;
      auVar39 = auVar65._0_32_;
      auVar63 = auVar64._0_28_;
      auVar61 = auVar62._0_28_;
      auVar68 = auVar69._0_28_;
      auVar59 = auVar60._0_28_;
      auVar25 = auVar30._0_16_;
      auVar32 = auVar70._0_32_;
      if ((((((((local_2a0 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (local_2a0 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (local_2a0 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(local_2a0 >> 0x7f,0) == '\0') &&
            (local_2a0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(local_2a0 >> 0xbf,0) == '\0') &&
          (local_2a0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < local_2a0[0x1f]) goto LAB_00952a75;
      auVar26 = vblendvps_avx(auVar54._0_32_,local_80,local_2a0);
      auVar34 = vshufps_avx(auVar26,auVar26,0xb1);
      auVar34 = vminps_avx(auVar26,auVar34);
      auVar39 = vshufpd_avx(auVar34,auVar34,5);
      auVar34 = vminps_avx(auVar34,auVar39);
      auVar39 = vperm2f128_avx(auVar34,auVar34,1);
      auVar66 = vminps_avx(auVar34,auVar39);
      auVar26 = vcmpps_avx(auVar26,auVar66,0);
      auVar39 = local_2a0 & auVar26;
      auVar34 = local_2a0;
      if ((((((((auVar39 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar39 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar39 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar39 >> 0x7f,0) != '\0') ||
            (auVar39 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar39 >> 0xbf,0) != '\0') ||
          (auVar39 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar39[0x1f] < '\0') {
        auVar34 = vandps_avx(auVar26,local_2a0);
      }
      uVar21 = vmovmskps_avx(auVar34);
      uVar22 = 0;
      if (uVar21 != 0) {
        for (; (uVar21 >> uVar22 & 1) == 0; uVar22 = uVar22 + 1) {
        }
      }
      goto LAB_00952722;
    }
  }
  return;
}

Assistant:

static __forceinline void intersect(const Precalculations& pre,
                                          RayHit& ray,
                                          RayQueryContext* context,
                                          const Primitive& sphere)
      {
        STAT3(normal.trav_prims, 1, 1, 1);
        const Points* geom = context->scene->get<Points>(sphere.geomID());
        Vec4vf<M> v0; sphere.gather(v0, geom);
        const vbool<M> valid = sphere.valid();
        SphereIntersector1<M>::intersect(
          valid, ray, context, geom, pre, v0, Intersect1EpilogM<M, filter>(ray, context, sphere.geomID(), sphere.primID()));
      }